

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmpcfgs.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  SpecificStrategy *this;
  SimpleStrategy *this_00;
  string *e;
  SpecificStrategy *local_a0;
  Strategy *strategy;
  list<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_88;
  undefined1 local_68 [8];
  StrategyConfig config;
  char **argv_local;
  int argc_local;
  
  local_88.
  super__List_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
  local_88.
  super__List_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
  local_88.
  super__List_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl._M_node._M_size = 0;
  config.input2 = (char *)argv;
  std::__cxx11::
  list<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::list(&local_88);
  StrategyConfig::StrategyConfig
            ((StrategyConfig *)local_68,false,false,false,false,&local_88,(char *)0x0,(char *)0x0,
             (char *)0x0,(char *)0x0,(char *)0x0);
  std::__cxx11::
  list<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::~list(&local_88);
  local_a0 = (SpecificStrategy *)0x0;
  readoptions((StrategyConfig *)&e,argc,(char **)config.input2);
  StrategyConfig::operator=((StrategyConfig *)local_68,(StrategyConfig *)&e);
  StrategyConfig::~StrategyConfig((StrategyConfig *)&e);
  if ((config._vptr_StrategyConfig._2_1_ & 1) == 0) {
    this_00 = (SimpleStrategy *)operator_new(0x268);
    SimpleStrategy::SimpleStrategy(this_00,(StrategyConfig *)local_68);
    local_a0 = (SpecificStrategy *)this_00;
  }
  else {
    this = (SpecificStrategy *)operator_new(0x268);
    SpecificStrategy::SpecificStrategy(this,(StrategyConfig *)local_68);
    local_a0 = this;
  }
  (*(local_a0->super_Strategy)._vptr_Strategy[2])();
  if ((local_a0 != (SpecificStrategy *)0x0) && (local_a0 != (SpecificStrategy *)0x0)) {
    (*(local_a0->super_Strategy)._vptr_Strategy[1])();
  }
  StrategyConfig::~StrategyConfig((StrategyConfig *)local_68);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
	StrategyConfig config;
	Strategy* strategy = 0;

	try {
		config = readoptions(argc, argv);
		if (config.specific)
			strategy = new SpecificStrategy(config);
		else
			strategy = new SimpleStrategy(config);

		strategy->process();
	} catch (const std::string& e) {
		std::cerr << e << std::endl;
	}

	if (strategy)
		delete strategy;

	return 0;
}